

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_initializer_expression_abi_cxx11_
          (CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  SPIRConstant *pSVar4;
  long in_RDX;
  SPIRConstant *c;
  bool is_block;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 0xc));
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)var,uVar2);
  bVar1 = Compiler::has_decoration
                    ((Compiler *)var,(ID)(pSVar3->super_IVariant).self.id,DecorationBlock);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 0x18));
  pSVar4 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)var,uVar2);
  if ((bVar1) && (pSVar4 != (SPIRConstant *)0x0)) {
    CompilerGLSL::constant_expression_abi_cxx11_
              (&this->super_CompilerGLSL,(SPIRConstant *)var,SUB81(pSVar4,0),false);
  }
  else {
    CompilerGLSL::to_initializer_expression_abi_cxx11_(&this->super_CompilerGLSL,var);
  }
  return this;
}

Assistant:

std::string CompilerHLSL::to_initializer_expression(const SPIRVariable &var)
{
	// We cannot emit static const initializer for block constants for practical reasons,
	// so just inline the initializer.
	// FIXME: There is a theoretical problem here if someone tries to composite extract
	// into this initializer since we don't declare it properly, but that is somewhat non-sensical.
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	auto *c = maybe_get<SPIRConstant>(var.initializer);
	if (is_block && c)
		return constant_expression(*c);
	else
		return CompilerGLSL::to_initializer_expression(var);
}